

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O0

int slab_arena_create(slab_arena *arena,quota *quota,size_t prealloc,uint32_t slab_size,int flags)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  bool bVar4;
  size_t local_48;
  ulong local_40;
  uint local_30;
  int flags_local;
  uint32_t slab_size_local;
  size_t prealloc_local;
  quota *quota_local;
  slab_arena *arena_local;
  
  lf_lifo_init(&arena->cache);
  local_30 = slab_size;
  if (slab_size < 0x10001) {
    local_30 = 0x10000;
  }
  sVar2 = small_round((ulong)local_30);
  arena->slab_size = (uint32_t)sVar2;
  arena->quota = quota;
  sVar2 = quota_total(quota);
  local_40 = prealloc;
  if (sVar2 <= prealloc) {
    local_40 = quota_total(quota);
  }
  if (local_40 < -(ulong)arena->slab_size - 1) {
    local_48 = local_40;
  }
  else {
    local_48 = -(ulong)arena->slab_size - 1;
  }
  sVar2 = small_align(local_48,(ulong)arena->slab_size);
  arena->prealloc = sVar2;
  arena->used = 0;
  slab_arena_flags_init(arena,flags);
  if (arena->prealloc == 0) {
    arena->arena = (void *)0x0;
  }
  else {
    pvVar3 = mmap_checked(arena->prealloc,(ulong)arena->slab_size,arena->flags);
    arena->arena = pvVar3;
  }
  madvise_checked(arena->arena,arena->prealloc,arena->flags);
  bVar4 = false;
  if (arena->prealloc != 0) {
    bVar4 = arena->arena == (void *)0x0;
  }
  iVar1 = 0;
  if (bVar4) {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
slab_arena_create(struct slab_arena *arena, struct quota *quota,
		  size_t prealloc, uint32_t slab_size, int flags)
{
	lf_lifo_init(&arena->cache);
	VALGRIND_MAKE_MEM_DEFINED(&arena->cache, sizeof(struct lf_lifo));

	/*
	 * Round up the user supplied data - it can come in
	 * directly from the configuration file. Allow
	 * zero-size arena for testing purposes.
	 */
	arena->slab_size = small_round(MAX(slab_size, SLAB_MIN_SIZE));

	arena->quota = quota;
	/** Prealloc can not be greater than the quota */
	prealloc = MIN(prealloc, quota_total(quota));
	/** Extremely large sizes can not be aligned properly */
	prealloc = MIN(prealloc, SIZE_MAX - arena->slab_size);
	/* Align prealloc around a fixed number of slabs. */
	arena->prealloc = small_align(prealloc, arena->slab_size);

	arena->used = 0;

	slab_arena_flags_init(arena, flags);

	if (arena->prealloc) {
		arena->arena = mmap_checked(arena->prealloc,
					    arena->slab_size,
					    arena->flags);
	} else {
		arena->arena = NULL;
	}

	madvise_checked(arena->arena, arena->prealloc, arena->flags);

	return arena->prealloc && !arena->arena ? -1 : 0;
}